

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadCount(BinaryReader *this,Index *count,char *desc)

{
  bool bVar1;
  Result result;
  ulong uVar2;
  size_t section_remaining;
  char *desc_local;
  Index *count_local;
  BinaryReader *this_local;
  
  result = ReadIndex(this,count,desc);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    uVar2 = this->read_end_ - (this->state_).offset;
    if (uVar2 < *count) {
      PrintError(this,"invalid %s %u, only %zd bytes left in section",desc,(ulong)*count,uVar2);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadCount(Index* count, const char* desc) {
  CHECK_RESULT(ReadIndex(count, desc));

  // This check assumes that each item follows in this section, and takes at
  // least 1 byte. It's possible that this check passes but reading fails
  // later. It is still useful to check here, though, because it early-outs
  // when an erroneous large count is used, before allocating memory for it.
  size_t section_remaining = read_end_ - state_.offset;
  if (*count > section_remaining) {
    PrintError("invalid %s %" PRIindex ", only %" PRIzd
               " bytes left in section",
               desc, *count, section_remaining);
    return Result::Error;
  }
  return Result::Ok;
}